

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O3

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_>::KsiBar
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_> *this,TPZVec<double> *ksi,
          TPZVec<double> *ksibar,TPZFMatrix<double> *jac)

{
  double *pdVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  TPZFNMatrix<2,_double> dphi;
  TPZFNMatrix<2,_double> phi;
  double local_188;
  TPZFMatrix<double> local_180;
  double local_f0 [3];
  TPZFMatrix<double> local_d8;
  double local_48 [3];
  
  local_d8.fElem = local_48;
  local_d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018d8cf8;
  local_d8.fSize = 2;
  local_d8.fGiven = local_d8.fElem;
  TPZVec<int>::TPZVec(&local_d8.fPivot.super_TPZVec<int>,0);
  local_d8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_d8.fPivot.super_TPZVec<int>.fStore = local_d8.fPivot.fExtAlloc;
  local_d8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_d8.fWork.fStore = (double *)0x0;
  local_d8.fWork.fNElements = 0;
  local_d8.fWork.fNAlloc = 0;
  local_d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018d8a08;
  TPZFMatrix<double>::operator=(&local_d8,0.0);
  local_180.fElem = local_f0;
  local_180.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
  local_180.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_180.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_180.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_180.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018d8cf8;
  local_180.fSize = 2;
  local_180.fGiven = local_180.fElem;
  TPZVec<int>::TPZVec(&local_180.fPivot.super_TPZVec<int>,0);
  local_180.fPivot.super_TPZVec<int>.fStore = local_180.fPivot.fExtAlloc;
  local_180.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_180.fPivot.super_TPZVec<int>.fNElements = 0;
  local_180.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_180.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_180.fWork.fStore = (double *)0x0;
  local_180.fWork.fNElements = 0;
  local_180.fWork.fNAlloc = 0;
  local_180.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018d8a08;
  TPZFMatrix<double>::operator=(&local_180,0.0);
  pztopology::TPZLine::TShape<double>(ksi,&local_d8,&local_180);
  (*(jac->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (jac,1,1);
  local_188 = 0.0;
  TPZVec<double>::Fill(ksibar,&local_188,0,-1);
  lVar4 = 0;
  bVar5 = true;
  while( true ) {
    if ((local_d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar4) ||
       (local_d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1 = (this->fCornerCo).super_TPZFMatrix<double>.fElem;
    lVar3 = (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            fRow * lVar4;
    *ksibar->fStore = local_d8.fElem[lVar4] * pdVar1[lVar3] + *ksibar->fStore;
    if ((local_180.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
       (local_180.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) break;
    if (((jac->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((jac->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    *jac->fElem = local_180.fElem
                  [local_180.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4] *
                  pdVar1[lVar3] + *jac->fElem;
    lVar4 = 1;
    bVar2 = !bVar5;
    bVar5 = false;
    if (bVar2) {
      TPZFMatrix<double>::~TPZFMatrix(&local_180,&PTR_PTR_018d8cc0);
      TPZFMatrix<double>::~TPZFMatrix(&local_d8,&PTR_PTR_018d8cc0);
      return;
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void KsiBar(TPZVec<REAL> &ksi, TPZVec<REAL> &ksibar, TPZFMatrix<REAL> &jac) const
    {
		const int dim = Geo::Dimension;
		TPZFNMatrix<Geo::NNodes> phi(Geo::NNodes,1,0.);
		TPZFNMatrix<dim*Geo::NNodes> dphi(dim,Geo::NNodes,0.);
		Geo::Shape(ksi,phi,dphi);
		jac.Redim(dim,dim);
		ksibar.Fill(0.);
		int in,id,jd;
		for(in=0; in<Geo::NNodes; in++)
		{
			for(id=0; id<dim; id++)
			{
				ksibar[id] += phi(in,0)*fCornerCo.GetVal(id,in);
				for(jd=0; jd<dim; jd++)
				{
					jac(id,jd) += dphi(jd,in)*fCornerCo.GetVal(id,in);
				}
			}
		}
    }